

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QRect __thiscall QDockAreaLayoutInfo::separatorRect(QDockAreaLayoutInfo *this,int index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  QDockAreaLayoutItem *this_00;
  QRect QVar12;
  
  uVar9 = 0xffffffff00000000;
  uVar11 = 0xffffffff;
  if (this->tabbed == false) {
    this_00 = (this->item_list).d.ptr + index;
    bVar5 = QDockAreaLayoutItem::skip(this_00);
    if (!bVar5) {
      uVar1 = (this->rect).x1.m_i;
      uVar2 = (this->rect).y1.m_i;
      uVar6 = this_00->size + this_00->pos;
      iVar10 = ((this->rect).y2.m_i - uVar2) + 1;
      bVar5 = this->o == Horizontal;
      uVar4 = uVar1;
      if (bVar5) {
        uVar4 = uVar6;
      }
      uVar8 = (ulong)uVar4;
      if (bVar5) {
        uVar6 = uVar2;
      }
      iVar3 = *this->sep;
      if (!bVar5) {
        iVar10 = iVar3;
        iVar3 = ((this->rect).x2.m_i - uVar1) + 1;
      }
      uVar11 = (ulong)((uVar4 + iVar3) - 1);
      uVar7 = (ulong)uVar6 << 0x20;
      uVar9 = (ulong)((uVar6 + iVar10) - 1) << 0x20;
      goto LAB_003f8df4;
    }
  }
  uVar7 = 0;
  uVar8 = 0;
LAB_003f8df4:
  QVar12._0_8_ = uVar7 | uVar8;
  QVar12.x2.m_i = (int)(uVar9 | uVar11);
  QVar12.y2.m_i = (int)((uVar9 | uVar11) >> 0x20);
  return QVar12;
}

Assistant:

QRect QDockAreaLayoutInfo::separatorRect(int index) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QRect();
#endif

    const QDockAreaLayoutItem &item = item_list.at(index);
    if (item.skip())
        return QRect();

    QPoint pos = rect.topLeft();
    rpick(o, pos) = item.pos + item.size;
    QSize s = rect.size();
    rpick(o, s) = *sep;

    return QRect(pos, s);
}